

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<long_double>_>::Decompose_LDLt(TPZMatrix<std::complex<long_double>_> *this)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  int k;
  ulong uVar4;
  long lVar5;
  complex<long_double> *__z;
  ulong uVar6;
  int k_1;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble local_160;
  longdouble local_154;
  complex<long_double> __r_1;
  complex<long_double> __r_3;
  long local_108;
  complex<long_double> tmp;
  undefined1 local_b8 [32];
  complex<long_double> local_98;
  undefined1 local_78 [32];
  complex<long_double> local_58;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (bVar1 != 0) {
    if (bVar1 == 4) {
      return (uint)bVar1;
    }
    Error("Decompose_LDLt <Matrix already Decomposed with other scheme> ",(char *)0x0);
  }
  uVar3 = (this->super_TPZBaseMatrix).fRow;
  if (uVar3 != (this->super_TPZBaseMatrix).fCol) {
    Error("Decompose_LDLt <Matrix must be square>",(char *)0x0);
    uVar3 = (this->super_TPZBaseMatrix).fRow;
  }
  uVar6 = 0;
  uVar2 = 0;
  if (0 < (int)uVar3) {
    uVar2 = uVar3 & 0xffffffff;
  }
  local_108 = 1;
  for (; uVar6 != uVar2; uVar6 = uVar6 + 1) {
    local_160 = (longdouble)0;
    lVar7 = in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    local_154 = local_160;
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&__r_3,this,uVar4,uVar4);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (local_b8,this,uVar4,uVar6);
      local_98._M_value._0_8_ = SUB108(local_b8._0_10_,0);
      local_98._M_value._8_2_ = SUB102(local_b8._0_10_,8);
      local_98._M_value._16_8_ = SUB108(-(longdouble)local_b8._16_10_,0);
      local_98._M_value._24_2_ = SUB102((unkuint10)-(longdouble)local_b8._16_10_ >> 0x40,0);
      tmp._M_value._10_4_ = __r_3._M_value._10_4_;
      tmp._M_value._8_2_ = __r_3._M_value._8_2_;
      tmp._M_value._14_2_ = __r_3._M_value._14_2_;
      tmp._M_value._26_4_ = __r_3._M_value._26_4_;
      tmp._M_value._24_2_ = __r_3._M_value._24_2_;
      tmp._M_value._30_2_ = __r_3._M_value._30_2_;
      tmp._M_value._0_8_ = __r_3._M_value._0_8_;
      tmp._M_value._16_8_ = __r_3._M_value._16_8_;
      std::complex<long_double>::operator*=(&tmp,&local_98);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                ((complex<long_double> *)local_78,this,uVar4,uVar6);
      __r_1._M_value._16_4_ = tmp._M_value._16_4_;
      __r_1._M_value._20_4_ = tmp._M_value._20_4_;
      __r_1._M_value._24_2_ = tmp._M_value._24_2_;
      __r_1._M_value._26_2_ = tmp._M_value._26_2_;
      __r_1._M_value._28_2_ = tmp._M_value._28_2_;
      __r_1._M_value._30_2_ = tmp._M_value._30_2_;
      __r_1._M_value._0_4_ = tmp._M_value._0_4_;
      __r_1._M_value._4_4_ = tmp._M_value._4_4_;
      __r_1._M_value._8_2_ = tmp._M_value._8_2_;
      __r_1._M_value._10_2_ = tmp._M_value._10_2_;
      __r_1._M_value._12_2_ = tmp._M_value._12_2_;
      __r_1._M_value._14_2_ = tmp._M_value._14_2_;
      std::complex<long_double>::operator*=(&__r_1,(complex<long_double> *)local_78);
      local_154 = local_154 +
                  (longdouble)
                  CONCAT28(__r_1._M_value._8_2_,CONCAT44(__r_1._M_value._4_4_,__r_1._M_value._0_4_))
      ;
      local_160 = local_160 +
                  (longdouble)
                  CONCAT28(__r_1._M_value._24_2_,
                           CONCAT44(__r_1._M_value._20_4_,__r_1._M_value._16_4_));
    }
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&tmp,this,uVar6,uVar6);
    __r_1._M_value._8_2_ = tmp._M_value._8_2_;
    __r_1._M_value._10_2_ = tmp._M_value._10_2_;
    __r_1._M_value._12_2_ = tmp._M_value._12_2_;
    __r_1._M_value._14_2_ = tmp._M_value._14_2_;
    __r_1._M_value._24_2_ = tmp._M_value._24_2_;
    __r_1._M_value._26_2_ = tmp._M_value._26_2_;
    __r_1._M_value._28_2_ = tmp._M_value._28_2_;
    __r_1._M_value._30_2_ = tmp._M_value._30_2_;
    local_154 = (longdouble)CONCAT28(__r_1._M_value._8_2_,tmp._M_value._0_8_) - local_154;
    local_160 = (longdouble)CONCAT28(__r_1._M_value._24_2_,tmp._M_value._16_8_) - local_160;
    __r_1._M_value._0_4_ = SUB104(local_154,0);
    __r_1._M_value._4_4_ = SUB104((unkuint10)local_154 >> 0x20,0);
    __r_1._M_value._8_2_ = SUB102((unkuint10)local_154 >> 0x40,0);
    __r_1._M_value._16_4_ = SUB104(local_160,0);
    __r_1._M_value._20_4_ = SUB104((unkuint10)local_160 >> 0x20,0);
    __r_1._M_value._24_2_ = SUB102((unkuint10)local_160 >> 0x40,0);
    in_ST4 = in_ST3;
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,uVar6,uVar6,&__r_1);
    __z = (complex<long_double> *)this;
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&tmp,this,uVar6,uVar6);
    __r_1._M_value._16_4_ = tmp._M_value._16_4_;
    __r_1._M_value._20_4_ = tmp._M_value._20_4_;
    __r_1._M_value._24_2_ = tmp._M_value._24_2_;
    __r_1._M_value._26_2_ = tmp._M_value._26_2_;
    __r_1._M_value._28_2_ = tmp._M_value._28_2_;
    __r_1._M_value._30_2_ = tmp._M_value._30_2_;
    __r_1._M_value._0_4_ = tmp._M_value._0_4_;
    __r_1._M_value._4_4_ = tmp._M_value._4_4_;
    __r_1._M_value._8_2_ = tmp._M_value._8_2_;
    __r_1._M_value._10_2_ = tmp._M_value._10_2_;
    __r_1._M_value._12_2_ = tmp._M_value._12_2_;
    __r_1._M_value._14_2_ = tmp._M_value._14_2_;
    std::abs<long_double>((longdouble *)&__r_1,__z);
    lVar5 = local_108;
    if (ABS(lVar7) < (longdouble)1e-16) {
      Error("Decompose_LDLt <Zero on diagonal>",(char *)0x0);
    }
    for (; (int)lVar5 < (int)uVar3; lVar5 = lVar5 + 1) {
      local_160 = (longdouble)0;
      local_154 = local_160;
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_98,this,uVar4,uVar4);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (local_78,this,uVar6,uVar4);
        local_b8._16_10_ = -(longdouble)local_78._16_10_;
        local_b8._0_10_ = local_78._0_10_;
        __r_3._M_value._0_8_ = local_98._M_value._0_8_;
        __r_3._M_value._8_2_ = local_98._M_value._8_2_;
        __r_3._M_value._10_4_ = local_98._M_value._10_4_;
        __r_3._M_value._14_2_ = local_98._M_value._14_2_;
        __r_3._M_value._16_8_ = local_98._M_value._16_8_;
        __r_3._M_value._24_2_ = local_98._M_value._24_2_;
        __r_3._M_value._26_4_ = local_98._M_value._26_4_;
        __r_3._M_value._30_2_ = local_98._M_value._30_2_;
        std::complex<long_double>::operator*=(&__r_3,(complex<long_double> *)local_b8);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_58,this,lVar5,uVar4);
        __r_1._M_value._16_4_ = __r_3._M_value._16_4_;
        __r_1._M_value._20_4_ = __r_3._M_value._20_4_;
        __r_1._M_value._24_2_ = __r_3._M_value._24_2_;
        __r_1._M_value._26_2_ = __r_3._M_value._26_2_;
        __r_1._M_value._28_2_ = __r_3._M_value._28_2_;
        __r_1._M_value._30_2_ = __r_3._M_value._30_2_;
        __r_1._M_value._0_4_ = __r_3._M_value._0_4_;
        __r_1._M_value._4_4_ = __r_3._M_value._4_4_;
        __r_1._M_value._8_2_ = __r_3._M_value._8_2_;
        __r_1._M_value._10_2_ = __r_3._M_value._10_2_;
        __r_1._M_value._12_2_ = __r_3._M_value._12_2_;
        __r_1._M_value._14_2_ = __r_3._M_value._14_2_;
        std::complex<long_double>::operator*=(&__r_1,&local_58);
        local_154 = local_154 +
                    (longdouble)
                    CONCAT28(__r_1._M_value._8_2_,
                             CONCAT44(__r_1._M_value._4_4_,__r_1._M_value._0_4_));
        local_160 = local_160 +
                    (longdouble)
                    CONCAT28(__r_1._M_value._24_2_,
                             CONCAT44(__r_1._M_value._20_4_,__r_1._M_value._16_4_));
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&__r_3,this,lVar5,uVar6);
      __r_1._M_value._14_2_ = __r_3._M_value._14_2_;
      __r_1._M_value._10_2_ = __r_3._M_value._10_2_;
      __r_1._M_value._12_2_ = __r_3._M_value._12_2_;
      __r_1._M_value._30_2_ = __r_3._M_value._30_2_;
      __r_1._M_value._26_2_ = __r_3._M_value._26_2_;
      __r_1._M_value._28_2_ = __r_3._M_value._28_2_;
      local_154 = (longdouble)CONCAT28(__r_3._M_value._8_2_,__r_3._M_value._0_8_) - local_154;
      local_160 = (longdouble)CONCAT28(__r_3._M_value._24_2_,__r_3._M_value._16_8_) - local_160;
      __r_1._M_value._0_4_ = SUB104(local_154,0);
      __r_1._M_value._4_4_ = SUB104((unkuint10)local_154 >> 0x20,0);
      __r_1._M_value._8_2_ = SUB102((unkuint10)local_154 >> 0x40,0);
      __r_1._M_value._16_4_ = SUB104(local_160,0);
      __r_1._M_value._20_4_ = SUB104((unkuint10)local_160 >> 0x20,0);
      __r_1._M_value._24_2_ = SUB102((unkuint10)local_160 >> 0x40,0);
      std::complex<long_double>::operator/=(&__r_1,&tmp);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,lVar5,uVar6,&__r_1);
      lVar7 = -(longdouble)
               CONCAT28(__r_1._M_value._24_2_,CONCAT44(__r_1._M_value._20_4_,__r_1._M_value._16_4_))
      ;
      __r_1._M_value._16_4_ = SUB104(lVar7,0);
      __r_1._M_value._20_4_ = SUB104((unkuint10)lVar7 >> 0x20,0);
      __r_1._M_value._24_2_ = SUB102((unkuint10)lVar7 >> 0x40,0);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,uVar6,lVar5,&__r_1);
    }
    local_108 = local_108 + 1;
  }
  (this->super_TPZBaseMatrix).fDecomposed = '\x04';
  (this->super_TPZBaseMatrix).fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}